

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O3

EVstone INT_EVexecuting_stone(CManager_conflict cm)

{
  _event_path_data *p_Var1;
  pthread_t pVar2;
  ev_handler_activation_ptr p_Var3;
  event_path_data evp;
  
  p_Var1 = cm->evp;
  pVar2 = pthread_self();
  p_Var3 = p_Var1->activation_stack;
  while( true ) {
    if (p_Var3 == (ev_handler_activation_ptr)0x0) {
      return -1;
    }
    if (p_Var3->thread_id == pVar2) break;
    p_Var3 = p_Var3->next;
  }
  return p_Var3->stone_id;
}

Assistant:

extern EVstone
INT_EVexecuting_stone(CManager cm)
{
    ev_handler_activation_ptr rec = find_activation_record_from_stack(cm);
    if (!rec) return -1;
    return rec->stone_id;
}